

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void __thiscall arm::Arith2Inst::display(Arith2Inst *this,ostream *o)

{
  ostream *in_RSI;
  ostream *in_RDI;
  Reg in_stack_0000001c;
  ostream *in_stack_00000020;
  
  display_op((OpCode)((ulong)in_RSI >> 0x20),in_RDI);
  display_cond((ConditionCode)((ulong)in_RSI >> 0x38),in_RDI);
  std::operator<<(in_RSI," ");
  display_reg_name(in_stack_00000020,in_stack_0000001c);
  if (*(int *)(in_RDI + 8) != 3) {
    std::operator<<(in_RSI,", ");
    prelude::operator<<(in_RSI,(Displayable *)in_RDI);
  }
  return;
}

Assistant:

void Arith2Inst::display(std::ostream &o) const {
  display_op(op, o);
  display_cond(cond, o);
  o << " ";
  display_reg_name(o, r1);
  if (op != OpCode::Bx) {
    o << ", " << r2;
  }
}